

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PerseusStationary::GetImmediateRewardBeliefSet(PerseusStationary *this)

{
  AlphaVectorPlanning *in_RDI;
  PlanningUnitDecPOMDPDiscrete *in_stack_00000018;
  ValueFunctionPOMDPDiscrete *in_stack_00000030;
  BeliefSet *in_stack_00000038;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *this_00;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_28;
  
  AlphaVectorPlanning::GetPU(in_RDI);
  this_00 = &local_28;
  AlphaVectorPlanning::GetImmediateRewardValueFunction(in_stack_00000018);
  BeliefValue::GetValues(in_stack_00000038,in_stack_00000030);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(this_00);
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<double> PerseusStationary::GetImmediateRewardBeliefSet() const
{
    return(BeliefValue::GetValues(*_m_beliefs,
                                  AlphaVectorPlanning::
                                  GetImmediateRewardValueFunction(GetPU())));
}